

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternparser.cpp
# Opt level: O3

void __thiscall
PatternParser::parseFixedPattern
          (PatternParser *this,Pattern *pattern,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  iterator __position;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  InputError *pIVar5;
  uint uVar6;
  long lVar7;
  string *s1;
  string local_b8;
  string local_98;
  string local_78;
  double local_58;
  double factor;
  string s2;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)((ulong)((long)(tokenList->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5);
  if ((int)uVar6 < 2) {
    pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
    InputError::InputError(pIVar5,2,&local_b8);
    __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
  }
  factor = (double)&s2._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&factor,"FIXED","");
  s1 = pbVar1 + 1;
  bVar3 = Utilities::match(s1,(string *)&factor);
  if ((size_type *)factor != &s2._M_string_length) {
    operator_delete((void *)factor);
  }
  if (bVar3) {
    if (uVar6 != 2) {
      factor = (double)&s2._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&factor,"");
      iVar4 = Utilities::getSeconds(pbVar1 + 2,(string *)&factor);
      if (iVar4 < 1) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        pcVar2 = pbVar1[2]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
        InputError::InputError(pIVar5,7,&local_98);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      pattern->interval = iVar4;
      if ((size_type *)factor != &s2._M_string_length) {
        operator_delete((void *)factor);
      }
    }
  }
  else {
    lVar7 = (ulong)(uVar6 & 0x7fffffff) - 1;
    do {
      bVar3 = Utilities::parseNumber<double>(s1,&local_58);
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar2 = (s1->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar2,pcVar2 + s1->_M_string_length);
        InputError::InputError(pIVar5,6,&local_78);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
      factor = local_58;
      __position._M_current =
           (pattern->factors).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pattern->factors).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&pattern->factors,__position,&factor);
      }
      else {
        *__position._M_current = local_58;
        (pattern->factors).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      s1 = s1 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void PatternParser::parseFixedPattern(Pattern* pattern, vector<string>& tokenList)
{
    // Formats are:
    //     PatternName  FIXED  (interval)
    //     PatternName  factor1  factor2  ...

    // ... check for enough tokens

    int nTokens = tokenList.size();
    if ( nTokens < 2 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... cast pattern to FixedPattern

    FixedPattern* fixedPat = static_cast<FixedPattern*>(pattern);

    // ... check if next token is the pattern type keyword

    if ( Utilities::match(tokens[1], "FIXED") )
    {
        // check if next token is the pattern interval

        if ( nTokens > 2 )
        {
            string s2 = "";
            int interval = Utilities::getSeconds(tokens[2], s2);
            if ( interval <= 0 ) throw InputError(InputError::INVALID_TIME, tokens[2]);
            fixedPat->setTimeInterval(interval);

        }
        return;
    }

    // ... read in pattern factors

    double factor;
    int i = 1;
    while ( i < nTokens )
    {
        if ( !Utilities::parseNumber(tokens[i], factor) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[i]);
        }
        fixedPat->addFactor(factor);
        i++;
    }
}